

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O1

void OperExt(OpConfig *EA)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = EA->Mode;
  if (uVar2 < 0xd) {
    if ((0x540U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x880U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 == 0xc) {
          if (Size == 1) {
            if (EA->Value - 0x100U < 0xfffffffffffffe80) goto LAB_001094ce;
          }
          else if ((Size == 2) && (EA->Value - 0x10000U < 0xfffffffffffe8000)) {
LAB_001094ce:
            Error(EA->Loc,9);
            return;
          }
        }
      }
      else {
        if ((long)(char)EA->Value != EA->Value) {
          Error(EA->Loc,9);
        }
        uVar3 = (long)(EA->Xn << 0xc) | (ulong)(byte)EA->Value;
        EA->Value = uVar3;
        if (EA->X == 2) {
          EA->Value = uVar3 | 0x8000;
        }
        if (EA->Xsize == 4) {
          pbVar1 = (byte *)((long)&EA->Value + 1);
          *pbVar1 = *pbVar1 | 8;
        }
      }
    }
    else if ((long)(short)EA->Value != EA->Value) goto LAB_001094ce;
  }
  return;
}

Assistant:

void 
OperExt (register struct OpConfig *EA)
/* Calculate operand Extension word, and check range of operands. */
{
	switch (EA->Mode) {
	case AbsL:
		break; /* No range checking is needed. */
	case AbsW:
	case ARDisp:
	case PCDisp:
		if ((EA->Value < -32768) || (EA->Value > 32767))
			Error(EA->Loc, SizeErr);
		break;
	case ARDisX:
	case PCDisX:
		if ((EA->Value < -128) || (EA->Value > 127))
			Error(EA->Loc, SizeErr);
		EA->Value &= 0x00FF; /* Displacement */
		EA->Value |= EA->Xn << 12; /* Index reg. */
		if (EA->X == Areg)
			EA->Value |= 0x8000; /* Addr. Reg. */
		if (EA->Xsize == Long)
			EA->Value |= 0x0800; /* Long reg.  */
		break;
	case Imm:
		if (Size == Word) {
			if ((EA->Value < -32768) || (EA->Value > 65535L))
				Error(EA->Loc, SizeErr);
		} else if (Size == Byte)
			if ((EA->Value < -128) || (EA->Value > 255))
				Error(EA->Loc, SizeErr);
		break;
	}
}